

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeedForwardNN.h
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
nnad::FeedForwardNN<double>::GetParameters(FeedForwardNN<double> *this)

{
  value_type vVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  reference pvVar5;
  const_reference pvVar6;
  int iVar7;
  vector<int,_std::allocator<int>_> *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  double dVar8;
  int ip;
  int j;
  int i;
  int l;
  int nl;
  int count;
  vector<double,_std::allocator<double>_> *output;
  allocator_type *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
  *in_stack_ffffffffffffff80;
  int local_40;
  int local_3c;
  int local_34;
  int iVar9;
  int iVar10;
  undefined4 in_stack_ffffffffffffffdc;
  Matrix<double> *in_stack_ffffffffffffffe0;
  
  std::allocator<double>::allocator((allocator<double> *)0x103f10);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff80,
             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),in_stack_ffffffffffffff70
            );
  std::allocator<double>::~allocator((allocator<double> *)0x103f33);
  iVar10 = 0;
  sVar3 = std::vector<int,_std::allocator<int>_>::size(in_RSI);
  iVar2 = (int)sVar3;
  iVar9 = iVar2;
  while (iVar9 = iVar9 + -1, 0 < iVar9) {
    for (local_34 = 0;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)iVar9),
        local_34 < *pvVar4; local_34 = local_34 + 1) {
      std::
      map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
      ::at(in_stack_ffffffffffffff80,
           (key_type *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      in_stack_ffffffffffffff80 =
           (map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
            *)Matrix<double>::GetElement
                        (in_stack_ffffffffffffffe0,(int *)CONCAT44(in_stack_ffffffffffffffdc,iVar10)
                         ,(int *)CONCAT44(iVar2,iVar9));
      iVar7 = iVar10 + 1;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(long)iVar10);
      *pvVar5 = (value_type)in_stack_ffffffffffffff80;
      local_3c = 0;
      iVar10 = iVar7;
      while (in_stack_ffffffffffffff7c = local_3c,
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)(iVar9 + -1)),
            in_stack_ffffffffffffff7c < *pvVar4) {
        std::
        map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
        ::at(in_stack_ffffffffffffff80,
             (key_type *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        dVar8 = Matrix<double>::GetElement
                          (in_stack_ffffffffffffffe0,
                           (int *)CONCAT44(in_stack_ffffffffffffffdc,iVar10),
                           (int *)CONCAT44(iVar2,iVar9));
        iVar7 = iVar10 + 1;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(long)iVar10);
        *pvVar5 = dVar8;
        local_3c = local_3c + 1;
        iVar10 = iVar7;
      }
    }
  }
  for (local_40 = 0;
      local_40 <
      *(int *)&in_RSI[6].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish; local_40 = local_40 + 1) {
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &in_RSI[5].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(long)local_40);
    vVar1 = *pvVar6;
    iVar9 = iVar10 + 1;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,(long)iVar10);
    *pvVar5 = vVar1;
    iVar10 = iVar9;
  }
  return in_RDI;
}

Assistant:

std::vector<T> GetParameters() const
    {
      // Initialise output vector
      std::vector<T> output(_Np + _NpPrep);

      // Element counter
      int count = 0;

      // Number of layers
      const int nl = (int) _Arch.size();

      // Neural network parameters
      for (int l = nl - 1; l > 0; l--)
        for (int i = 0; i < _Arch[l]; i++)
          {
            // Biases
            output[count++] = _Biases.at(l).GetElement(i, 0);

            // Links
            for (int j = 0; j < _Arch[l - 1]; j++)
              output[count++] = _Links.at(l).GetElement(i, j);
          }

      // Preprocessing parameters
      for (int ip = 0; ip < _NpPrep; ip++)
        output[count++] = _PreprocPars[ip];

      return output;
    }